

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *loop;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  int64_t eval_b_14;
  int64_t eval_a_14;
  uv_os_fd_t fds_stdout [2];
  uv_os_fd_t fds_stdin [2];
  uv_buf_t local_930;
  uv_write_t write_req;
  uchar ubuf [1023];
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_stdio_container_t child_stdio [2];
  uv_pipe_t pipe_stdin_child;
  uv_process_t child_req;
  
  init_process_options("spawn_helper9",exit_cb);
  loop = uv_default_loop();
  iVar1 = uv_pipe_init(loop,&pipe_stdin_child,0);
  eval_a_14 = (int64_t)iVar1;
  pipe_stdout_child.data = (void *)0x0;
  ubuf._0_8_ = eval_a_14;
  if ((void *)eval_a_14 == (void *)0x0) {
    iVar1 = uv_pipe_init(loop,&pipe_stdout_child,0);
    eval_a_14 = (int64_t)iVar1;
    pipe_stdin_parent.data = (void *)0x0;
    ubuf._0_8_ = eval_a_14;
    if ((void *)eval_a_14 == (void *)0x0) {
      iVar1 = uv_pipe_init(loop,&pipe_stdin_parent,0);
      eval_a_14 = (int64_t)iVar1;
      pipe_stdout_parent.data = (void *)0x0;
      ubuf._0_8_ = eval_a_14;
      if ((void *)eval_a_14 == (void *)0x0) {
        iVar1 = uv_pipe_init(loop,&pipe_stdout_parent,0);
        eval_a_14 = (int64_t)iVar1;
        write_req.data = (void *)0x0;
        ubuf._0_8_ = eval_a_14;
        if ((void *)eval_a_14 == (void *)0x0) {
          iVar1 = uv_pipe(fds_stdin,0,0);
          eval_a_14 = (int64_t)iVar1;
          write_req.data = (void *)0x0;
          ubuf._0_8_ = eval_a_14;
          if ((void *)eval_a_14 == (void *)0x0) {
            iVar1 = uv_pipe(fds_stdout,0,0);
            eval_a_14 = (int64_t)iVar1;
            write_req.data = (void *)0x0;
            ubuf._0_8_ = eval_a_14;
            if ((void *)eval_a_14 == (void *)0x0) {
              iVar1 = uv_pipe_open(&pipe_stdin_child,fds_stdin[0]);
              eval_a_14 = (int64_t)iVar1;
              write_req.data = (void *)0x0;
              ubuf._0_8_ = eval_a_14;
              if ((void *)eval_a_14 == (void *)0x0) {
                iVar1 = uv_pipe_open(&pipe_stdout_child,fds_stdout[1]);
                eval_a_14 = (int64_t)iVar1;
                write_req.data = (void *)0x0;
                ubuf._0_8_ = eval_a_14;
                if ((void *)eval_a_14 == (void *)0x0) {
                  iVar1 = uv_pipe_open(&pipe_stdin_parent,fds_stdin[1]);
                  eval_a_14 = (int64_t)iVar1;
                  write_req.data = (void *)0x0;
                  ubuf._0_8_ = eval_a_14;
                  if ((void *)eval_a_14 == (void *)0x0) {
                    iVar1 = uv_pipe_open(&pipe_stdout_parent,fds_stdout[0]);
                    eval_a_14 = (int64_t)iVar1;
                    write_req.data = (void *)0x0;
                    ubuf._0_8_ = eval_a_14;
                    if ((void *)eval_a_14 == (void *)0x0) {
                      iVar1 = uv_is_readable((uv_stream_t *)&pipe_stdin_child);
                      if (iVar1 == 0) {
                        pcVar4 = "uv_is_readable((uv_stream_t*) &pipe_stdin_child)";
                        uVar3 = 0x7e7;
                      }
                      else {
                        iVar1 = uv_is_writable((uv_stream_t *)&pipe_stdout_child);
                        if (iVar1 == 0) {
                          pcVar4 = "uv_is_writable((uv_stream_t*) &pipe_stdout_child)";
                          uVar3 = 0x7e8;
                        }
                        else {
                          iVar1 = uv_is_writable((uv_stream_t *)&pipe_stdin_parent);
                          if (iVar1 == 0) {
                            pcVar4 = "uv_is_writable((uv_stream_t*) &pipe_stdin_parent)";
                            uVar3 = 0x7e9;
                          }
                          else {
                            iVar1 = uv_is_readable((uv_stream_t *)&pipe_stdout_parent);
                            if (iVar1 != 0) {
                              iVar1 = uv_is_writable((uv_stream_t *)&pipe_stdin_child);
                              iVar2 = uv_is_readable((uv_stream_t *)&pipe_stdout_child);
                              eval_a_14 = (int64_t)iVar2;
                              eval_b_14 = (int64_t)iVar1;
                              write_req.data = (void *)eval_b_14;
                              ubuf._0_8_ = eval_a_14;
                              if (eval_a_14 == eval_b_14) {
                                iVar1 = uv_is_readable((uv_stream_t *)&pipe_stdin_parent);
                                eval_a_14 = (int64_t)iVar1;
                                ubuf._0_8_ = eval_a_14;
                                if (eval_a_14 == eval_b_14) {
                                  write_req.data = (void *)eval_b_14;
                                  iVar1 = uv_is_writable((uv_stream_t *)&pipe_stdout_parent);
                                  eval_a_14 = (int64_t)iVar1;
                                  ubuf._0_8_ = eval_a_14;
                                  if (eval_a_14 == eval_b_14) {
                                    options.stdio = child_stdio;
                                    child_stdio[0].flags = UV_INHERIT_STREAM;
                                    options.stdio_count = 2;
                                    write_req.data = (void *)eval_b_14;
                                    child_stdio[0].data.stream = (uv_stream_t *)&pipe_stdin_child;
                                    child_stdio[1].flags = child_stdio[0].flags;
                                    child_stdio[1].data.stream = (uv_stream_t *)&pipe_stdout_child;
                                    iVar1 = uv_spawn(loop,&child_req,&options);
                                    eval_a_14 = (int64_t)iVar1;
                                    write_req.data = (void *)0x0;
                                    ubuf._0_8_ = eval_a_14;
                                    if ((void *)eval_a_14 == (void *)0x0) {
                                      uv_close((uv_handle_t *)&pipe_stdin_child,(uv_close_cb)0x0);
                                      uv_close((uv_handle_t *)&pipe_stdout_child,(uv_close_cb)0x0);
                                      local_930 = uv_buf_init((char *)ubuf,0x3ff);
                                      for (lVar6 = 0; lVar6 != 0x3ff; lVar6 = lVar6 + 1) {
                                        ubuf[lVar6] = (uchar)lVar6;
                                      }
                                      memset(output,0,0x3ff);
                                      iVar1 = uv_write(&write_req,(uv_stream_t *)&pipe_stdin_parent,
                                                       &local_930,1,write_cb);
                                      eval_a_14 = (int64_t)iVar1;
                                      eval_b_14 = 0;
                                      if ((void *)eval_a_14 == (void *)0x0) {
                                        iVar1 = uv_read_start((uv_stream_t *)&pipe_stdout_parent,
                                                              on_alloc,on_read);
                                        eval_a_14 = (int64_t)iVar1;
                                        eval_b_14 = 0;
                                        if ((void *)eval_a_14 == (void *)0x0) {
                                          iVar1 = uv_run(loop,UV_RUN_DEFAULT);
                                          eval_a_14 = (int64_t)iVar1;
                                          eval_b_14 = 0;
                                          if ((void *)eval_a_14 == (void *)0x0) {
                                            eval_a_14 = 1;
                                            eval_b_14 = (int64_t)exit_cb_called;
                                            if ((void *)eval_b_14 == (void *)0x1) {
                                              eval_a_14 = 3;
                                              eval_b_14 = (int64_t)close_cb_called;
                                              if ((void *)eval_b_14 == (void *)0x3) {
                                                iVar1 = memcmp(ubuf,output,0x3ff);
                                                eval_a_14 = (int64_t)iVar1;
                                                eval_b_14 = 0;
                                                if ((void *)eval_a_14 == (void *)0x0) {
                                                  close_loop(loop);
                                                  eval_a_14 = 0;
                                                  iVar1 = uv_loop_close(loop);
                                                  eval_b_14 = (int64_t)iVar1;
                                                  if ((void *)eval_b_14 == (void *)0x0) {
                                                    uv_library_shutdown();
                                                    return 0;
                                                  }
                                                  pcVar5 = "uv_loop_close(loop)";
                                                  pcVar4 = "0";
                                                  uVar3 = 0x817;
                                                }
                                                else {
                                                  pcVar5 = "0";
                                                  pcVar4 = "r";
                                                  uVar3 = 0x815;
                                                }
                                              }
                                              else {
                                                pcVar5 = "close_cb_called";
                                                pcVar4 = "3";
                                                uVar3 = 0x812;
                                              }
                                            }
                                            else {
                                              pcVar5 = "exit_cb_called";
                                              pcVar4 = "1";
                                              uVar3 = 0x811;
                                            }
                                          }
                                          else {
                                            pcVar5 = "0";
                                            pcVar4 = "r";
                                            uVar3 = 0x80f;
                                          }
                                        }
                                        else {
                                          pcVar5 = "0";
                                          pcVar4 = "r";
                                          uVar3 = 0x80c;
                                        }
                                      }
                                      else {
                                        pcVar5 = "0";
                                        pcVar4 = "r";
                                        uVar3 = 0x809;
                                      }
                                    }
                                    else {
                                      pcVar5 = "0";
                                      pcVar4 = "uv_spawn(loop, &child_req, &options)";
                                      uVar3 = 0x7fa;
                                      eval_b_14 = (int64_t)write_req.data;
                                    }
                                  }
                                  else {
                                    pcVar5 = "bidir";
                                    pcVar4 = "uv_is_writable((uv_stream_t*) &pipe_stdout_parent)";
                                    uVar3 = 0x7ef;
                                    write_req.data = (void *)eval_b_14;
                                  }
                                }
                                else {
                                  pcVar5 = "bidir";
                                  pcVar4 = "uv_is_readable((uv_stream_t*) &pipe_stdin_parent)";
                                  uVar3 = 0x7ee;
                                  write_req.data = (void *)eval_b_14;
                                }
                              }
                              else {
                                pcVar5 = "bidir";
                                pcVar4 = "uv_is_readable((uv_stream_t*) &pipe_stdout_child)";
                                uVar3 = 0x7ed;
                              }
                              goto LAB_0017a015;
                            }
                            pcVar4 = "uv_is_readable((uv_stream_t*) &pipe_stdout_parent)";
                            uVar3 = 0x7ea;
                          }
                        }
                      }
                      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                              ,uVar3,pcVar4);
                      abort();
                    }
                    pcVar5 = "0";
                    pcVar4 = "uv_pipe_open(&pipe_stdout_parent, fds_stdout[0])";
                    uVar3 = 0x7e6;
                    eval_b_14 = (int64_t)write_req.data;
                  }
                  else {
                    pcVar5 = "0";
                    pcVar4 = "uv_pipe_open(&pipe_stdin_parent, fds_stdin[1])";
                    uVar3 = 0x7e5;
                    eval_b_14 = (int64_t)write_req.data;
                  }
                }
                else {
                  pcVar5 = "0";
                  pcVar4 = "uv_pipe_open(&pipe_stdout_child, fds_stdout[1])";
                  uVar3 = 0x7e4;
                  eval_b_14 = (int64_t)write_req.data;
                }
              }
              else {
                pcVar5 = "0";
                pcVar4 = "uv_pipe_open(&pipe_stdin_child, fds_stdin[0])";
                uVar3 = 0x7e3;
                eval_b_14 = (int64_t)write_req.data;
              }
            }
            else {
              pcVar5 = "0";
              pcVar4 = "uv_pipe(fds_stdout, 0, 0)";
              uVar3 = 0x7e1;
              eval_b_14 = (int64_t)write_req.data;
            }
          }
          else {
            pcVar5 = "0";
            pcVar4 = "uv_pipe(fds_stdin, 0, 0)";
            uVar3 = 0x7e0;
            eval_b_14 = (int64_t)write_req.data;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "uv_pipe_init(loop, &pipe_stdout_parent, 0)";
          uVar3 = 0x7de;
          eval_b_14 = (int64_t)write_req.data;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "uv_pipe_init(loop, &pipe_stdin_parent, 0)";
        uVar3 = 0x7dd;
        eval_b_14 = 0;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "uv_pipe_init(loop, &pipe_stdout_child, 0)";
      uVar3 = 0x7dc;
      eval_b_14 = 0;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_pipe_init(loop, &pipe_stdin_child, 0)";
    uVar3 = 0x7db;
    eval_b_14 = 0;
  }
LAB_0017a015:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a_14,"==",eval_b_14);
  abort();
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  uv_os_fd_t fds_stdin[2];
  uv_os_fd_t fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdin_child, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdout_child, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdin_parent, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdout_parent, 0));

  ASSERT_OK(uv_pipe(fds_stdin, 0, 0));
  ASSERT_OK(uv_pipe(fds_stdout, 0, 0));

  ASSERT_OK(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]));
  ASSERT_OK(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]));
  ASSERT_OK(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]));
  ASSERT_OK(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT_EQ(uv_is_readable((uv_stream_t*) &pipe_stdout_child), bidir);
  ASSERT_EQ(uv_is_readable((uv_stream_t*) &pipe_stdin_parent), bidir);
  ASSERT_EQ(uv_is_writable((uv_stream_t*) &pipe_stdout_parent), bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *) &pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *) &pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT_OK(uv_spawn(loop, &child_req, &options));

  uv_close((uv_handle_t*) &pipe_stdin_child, NULL);
  uv_close((uv_handle_t*) &pipe_stdout_child, NULL);

  buf = uv_buf_init((char*) ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*) &pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &pipe_stdout_parent, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(3, close_cb_called);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}